

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodstocsv.cpp
# Opt level: O2

void doit(void)

{
  size_t sVar1;
  Periods p;
  
  puts("\"period_no\", \"weighting\"");
  sVar1 = fread(&p,0xc,1,_stdin);
  while (sVar1 != 0) {
    printf("%d, %0.9lf\n",p.weighting,(ulong)(uint)p.period_no);
    sVar1 = fread(&p,0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit()
{
	printf("\"period_no\", \"weighting\"\n");
	
	Periods p;
	size_t i = fread(&p, sizeof(p), 1, stdin);
	while (i != 0) {
		printf("%d, %0.9lf\n",	p.period_no, p.weighting);

		i = fread(&p, sizeof(p), 1, stdin);
    }

}